

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3RunVacuum(char **pzErrMsg,sqlite3 *db,int iDb,sqlite3_value *pOut)

{
  Btree *pBVar1;
  int iVar2;
  Pager *pPVar3;
  int local_c4;
  int local_a8;
  u32 local_a4;
  int i;
  u32 meta;
  i64 sz;
  sqlite3_file *id;
  char *zOut;
  char *zDbMain;
  int local_78;
  int nDb;
  int nRes;
  int isMemDb;
  Db *pDb;
  int iStack_60;
  u8 saved_mTrace;
  u32 saved_openFlags;
  int saved_nTotalChange;
  int saved_nChange;
  u64 saved_flags;
  Btree *pBStack_48;
  u32 saved_mDbFlags;
  Btree *pTemp;
  Btree *pMain;
  sqlite3_value *psStack_30;
  int rc;
  sqlite3_value *pOut_local;
  sqlite3 *psStack_20;
  int iDb_local;
  sqlite3 *db_local;
  char **pzErrMsg_local;
  
  pMain._4_4_ = 0;
  _nRes = (Db *)0x0;
  psStack_30 = pOut;
  pOut_local._4_4_ = iDb;
  psStack_20 = db;
  db_local = (sqlite3 *)pzErrMsg;
  if (db->autoCommit == '\0') {
    sqlite3SetString(pzErrMsg,db,"cannot VACUUM from within a transaction");
    return 1;
  }
  if (1 < db->nVdbeActive) {
    sqlite3SetString(pzErrMsg,db,"cannot VACUUM - SQL statements in progress");
    return 1;
  }
  pDb._4_4_ = db->openFlags;
  if (pOut == (sqlite3_value *)0x0) {
    id = (sqlite3_file *)0x2903fe;
  }
  else {
    iVar2 = sqlite3_value_type(pOut);
    if (iVar2 != 3) {
      sqlite3SetString((char **)db_local,psStack_20,"non-text filename");
      return 1;
    }
    id = (sqlite3_file *)sqlite3_value_text(psStack_30);
    psStack_20->openFlags = psStack_20->openFlags & 0xfffffffe;
    psStack_20->openFlags = psStack_20->openFlags | 6;
  }
  _saved_nTotalChange = psStack_20->flags;
  saved_flags._4_4_ = psStack_20->mDbFlags;
  saved_openFlags = psStack_20->nChange;
  iStack_60 = psStack_20->nTotalChange;
  pDb._3_1_ = psStack_20->mTrace;
  psStack_20->flags = psStack_20->flags | 0x201;
  psStack_20->mDbFlags = psStack_20->mDbFlags | 6;
  psStack_20->flags = psStack_20->flags & 0xffffffffefffaf7f;
  psStack_20->mTrace = '\0';
  zOut = psStack_20->aDb[pOut_local._4_4_].zDbSName;
  pTemp = psStack_20->aDb[pOut_local._4_4_].pBt;
  pPVar3 = sqlite3BtreePager(pTemp);
  nDb = sqlite3PagerIsMemdb(pPVar3);
  zDbMain._4_4_ = psStack_20->nDb;
  pMain._4_4_ = execSqlF(psStack_20,(char **)db_local,"ATTACH %Q AS vacuum_db",id);
  psStack_20->openFlags = pDb._4_4_;
  if (pMain._4_4_ == 0) {
    _nRes = psStack_20->aDb + zDbMain._4_4_;
    pBStack_48 = _nRes->pBt;
    if (psStack_30 != (sqlite3_value *)0x0) {
      pPVar3 = sqlite3BtreePager(pBStack_48);
      sz = (i64)sqlite3PagerFile(pPVar3);
      _i = 0;
      if ((((sqlite3_file *)sz)->pMethods != (sqlite3_io_methods *)0x0) &&
         ((iVar2 = sqlite3OsFileSize((sqlite3_file *)sz,(i64 *)&i), iVar2 != 0 || (0 < _i)))) {
        pMain._4_4_ = 1;
        sqlite3SetString((char **)db_local,psStack_20,"output file already exists");
        goto LAB_00202bd8;
      }
      psStack_20->mDbFlags = psStack_20->mDbFlags | 8;
    }
    local_78 = sqlite3BtreeGetOptimalReserve(pTemp);
    sqlite3BtreeSetCacheSize(pBStack_48,(psStack_20->aDb[pOut_local._4_4_].pSchema)->cache_size);
    pBVar1 = pBStack_48;
    iVar2 = sqlite3BtreeSetSpillSize(pTemp,0);
    sqlite3BtreeSetSpillSize(pBVar1,iVar2);
    sqlite3BtreeSetPagerFlags(pBStack_48,0x21);
    pMain._4_4_ = execSql(psStack_20,(char **)db_local,"BEGIN");
    if (pMain._4_4_ == 0) {
      iVar2 = 0;
      if (psStack_30 == (sqlite3_value *)0x0) {
        iVar2 = 2;
      }
      pMain._4_4_ = sqlite3BtreeBeginTrans(pTemp,iVar2,(int *)0x0);
      if (pMain._4_4_ == 0) {
        pPVar3 = sqlite3BtreePager(pTemp);
        iVar2 = sqlite3PagerGetJournalMode(pPVar3);
        pBVar1 = pBStack_48;
        if (iVar2 == 5) {
          psStack_20->nextPagesize = 0;
        }
        iVar2 = sqlite3BtreeGetPageSize(pTemp);
        iVar2 = sqlite3BtreeSetPageSize(pBVar1,iVar2,local_78,0);
        if ((iVar2 == 0) &&
           (((nDb != 0 ||
             (iVar2 = sqlite3BtreeSetPageSize(pBStack_48,psStack_20->nextPagesize,local_78,0),
             iVar2 == 0)) && (pBVar1 = pBStack_48, psStack_20->mallocFailed == '\0')))) {
          if (psStack_20->nextAutovac < '\0') {
            local_c4 = sqlite3BtreeGetAutoVacuum(pTemp);
          }
          else {
            local_c4 = (int)psStack_20->nextAutovac;
          }
          sqlite3BtreeSetAutoVacuum(pBVar1,local_c4);
          (psStack_20->init).iDb = (u8)zDbMain._4_4_;
          pMain._4_4_ = execSqlF(psStack_20,(char **)db_local,
                                 "SELECT sql FROM \"%w\".sqlite_master WHERE type=\'table\'AND name<>\'sqlite_sequence\' AND coalesce(rootpage,1)>0"
                                 ,zOut);
          if ((pMain._4_4_ == 0) &&
             (pMain._4_4_ = execSqlF(psStack_20,(char **)db_local,
                                     "SELECT sql FROM \"%w\".sqlite_master WHERE type=\'index\'",
                                     zOut), pMain._4_4_ == 0)) {
            (psStack_20->init).iDb = '\0';
            pMain._4_4_ = execSqlF(psStack_20,(char **)db_local,
                                   "SELECT\'INSERT INTO vacuum_db.\'||quote(name)||\' SELECT*FROM\"%w\".\'||quote(name)FROM vacuum_db.sqlite_master WHERE type=\'table\'AND coalesce(rootpage,1)>0"
                                   ,zOut);
            psStack_20->mDbFlags = psStack_20->mDbFlags & 0xfffffffb;
            if ((pMain._4_4_ == 0) &&
               (pMain._4_4_ = execSqlF(psStack_20,(char **)db_local,
                                       "INSERT INTO vacuum_db.sqlite_master SELECT*FROM \"%w\".sqlite_master WHERE type IN(\'view\',\'trigger\') OR(type=\'table\'AND rootpage=0)"
                                       ,zOut), pMain._4_4_ == 0)) {
              for (local_a8 = 0; local_a8 < 10; local_a8 = local_a8 + 2) {
                sqlite3BtreeGetMeta(pTemp,(uint)"\x01\x01\x03"[local_a8],&local_a4);
                pMain._4_4_ = sqlite3BtreeUpdateMeta
                                        (pBStack_48,(uint)"\x01\x01\x03"[local_a8],
                                         local_a4 + "\x01\x01\x03"[local_a8 + 1]);
                if (pMain._4_4_ != 0) goto LAB_00202bd8;
              }
              if (psStack_30 == (sqlite3_value *)0x0) {
                pMain._4_4_ = sqlite3BtreeCopyFile(pTemp,pBStack_48);
              }
              if ((pMain._4_4_ == 0) &&
                 (pMain._4_4_ = sqlite3BtreeCommit(pBStack_48), pBVar1 = pTemp, pMain._4_4_ == 0)) {
                if (psStack_30 == (sqlite3_value *)0x0) {
                  iVar2 = sqlite3BtreeGetAutoVacuum(pBStack_48);
                  sqlite3BtreeSetAutoVacuum(pBVar1,iVar2);
                }
                pBVar1 = pTemp;
                if (psStack_30 == (sqlite3_value *)0x0) {
                  iVar2 = sqlite3BtreeGetPageSize(pBStack_48);
                  pMain._4_4_ = sqlite3BtreeSetPageSize(pBVar1,iVar2,local_78,1);
                }
              }
            }
          }
        }
        else {
          pMain._4_4_ = 7;
        }
      }
    }
  }
LAB_00202bd8:
  (psStack_20->init).iDb = '\0';
  psStack_20->mDbFlags = saved_flags._4_4_;
  psStack_20->flags = _saved_nTotalChange;
  psStack_20->nChange = saved_openFlags;
  psStack_20->nTotalChange = iStack_60;
  psStack_20->mTrace = pDb._3_1_;
  sqlite3BtreeSetPageSize(pTemp,-1,-1,1);
  psStack_20->autoCommit = '\x01';
  if (_nRes != (Db *)0x0) {
    sqlite3BtreeClose(_nRes->pBt);
    _nRes->pBt = (Btree *)0x0;
    _nRes->pSchema = (Schema *)0x0;
  }
  sqlite3ResetAllSchemasOfConnection(psStack_20);
  return pMain._4_4_;
}

Assistant:

int sqlite3RunVacuum(
  char **pzErrMsg,        /* Write error message here */
  sqlite3 *db,            /* Database connection */
  int iDb,                /* Which attached DB to vacuum */
  sqlite3_value *pOut     /* Write results here, if not NULL. VACUUM INTO */
){
  int rc = SQLITE_OK;     /* Return code from service routines */
  Btree *pMain;           /* The database being vacuumed */
  Btree *pTemp;           /* The temporary database we vacuum into */
  u32 saved_mDbFlags;     /* Saved value of db->mDbFlags */
  u64 saved_flags;        /* Saved value of db->flags */
  int saved_nChange;      /* Saved value of db->nChange */
  int saved_nTotalChange; /* Saved value of db->nTotalChange */
  u32 saved_openFlags;    /* Saved value of db->openFlags */
  u8 saved_mTrace;        /* Saved trace settings */
  Db *pDb = 0;            /* Database to detach at end of vacuum */
  int isMemDb;            /* True if vacuuming a :memory: database */
  int nRes;               /* Bytes of reserved space at the end of each page */
  int nDb;                /* Number of attached databases */
  const char *zDbMain;    /* Schema name of database to vacuum */
  const char *zOut;       /* Name of output file */

  if( !db->autoCommit ){
    sqlite3SetString(pzErrMsg, db, "cannot VACUUM from within a transaction");
    return SQLITE_ERROR; /* IMP: R-12218-18073 */
  }
  if( db->nVdbeActive>1 ){
    sqlite3SetString(pzErrMsg, db,"cannot VACUUM - SQL statements in progress");
    return SQLITE_ERROR; /* IMP: R-15610-35227 */
  }
  saved_openFlags = db->openFlags;
  if( pOut ){
    if( sqlite3_value_type(pOut)!=SQLITE_TEXT ){
      sqlite3SetString(pzErrMsg, db, "non-text filename");
      return SQLITE_ERROR;
    }
    zOut = (const char*)sqlite3_value_text(pOut);
    db->openFlags &= ~SQLITE_OPEN_READONLY;
    db->openFlags |= SQLITE_OPEN_CREATE|SQLITE_OPEN_READWRITE;
  }else{
    zOut = "";
  }

  /* Save the current value of the database flags so that it can be 
  ** restored before returning. Then set the writable-schema flag, and
  ** disable CHECK and foreign key constraints.  */
  saved_flags = db->flags;
  saved_mDbFlags = db->mDbFlags;
  saved_nChange = db->nChange;
  saved_nTotalChange = db->nTotalChange;
  saved_mTrace = db->mTrace;
  db->flags |= SQLITE_WriteSchema | SQLITE_IgnoreChecks;
  db->mDbFlags |= DBFLAG_PreferBuiltin | DBFLAG_Vacuum;
  db->flags &= ~(u64)(SQLITE_ForeignKeys | SQLITE_ReverseOrder
                   | SQLITE_Defensive | SQLITE_CountRows);
  db->mTrace = 0;

  zDbMain = db->aDb[iDb].zDbSName;
  pMain = db->aDb[iDb].pBt;
  isMemDb = sqlite3PagerIsMemdb(sqlite3BtreePager(pMain));

  /* Attach the temporary database as 'vacuum_db'. The synchronous pragma
  ** can be set to 'off' for this file, as it is not recovered if a crash
  ** occurs anyway. The integrity of the database is maintained by a
  ** (possibly synchronous) transaction opened on the main database before
  ** sqlite3BtreeCopyFile() is called.
  **
  ** An optimisation would be to use a non-journaled pager.
  ** (Later:) I tried setting "PRAGMA vacuum_db.journal_mode=OFF" but
  ** that actually made the VACUUM run slower.  Very little journalling
  ** actually occurs when doing a vacuum since the vacuum_db is initially
  ** empty.  Only the journal header is written.  Apparently it takes more
  ** time to parse and run the PRAGMA to turn journalling off than it does
  ** to write the journal header file.
  */
  nDb = db->nDb;
  rc = execSqlF(db, pzErrMsg, "ATTACH %Q AS vacuum_db", zOut);
  db->openFlags = saved_openFlags;
  if( rc!=SQLITE_OK ) goto end_of_vacuum;
  assert( (db->nDb-1)==nDb );
  pDb = &db->aDb[nDb];
  assert( strcmp(pDb->zDbSName,"vacuum_db")==0 );
  pTemp = pDb->pBt;
  if( pOut ){
    sqlite3_file *id = sqlite3PagerFile(sqlite3BtreePager(pTemp));
    i64 sz = 0;
    if( id->pMethods!=0 && (sqlite3OsFileSize(id, &sz)!=SQLITE_OK || sz>0) ){
      rc = SQLITE_ERROR;
      sqlite3SetString(pzErrMsg, db, "output file already exists");
      goto end_of_vacuum;
    }
    db->mDbFlags |= DBFLAG_VacuumInto;
  }
  nRes = sqlite3BtreeGetOptimalReserve(pMain);

  /* A VACUUM cannot change the pagesize of an encrypted database. */
#ifdef SQLITE_HAS_CODEC
  if( db->nextPagesize ){
    extern void sqlite3CodecGetKey(sqlite3*, int, void**, int*);
    int nKey;
    char *zKey;
    sqlite3CodecGetKey(db, iDb, (void**)&zKey, &nKey);
    if( nKey ) db->nextPagesize = 0;
  }
#endif

  sqlite3BtreeSetCacheSize(pTemp, db->aDb[iDb].pSchema->cache_size);
  sqlite3BtreeSetSpillSize(pTemp, sqlite3BtreeSetSpillSize(pMain,0));
  sqlite3BtreeSetPagerFlags(pTemp, PAGER_SYNCHRONOUS_OFF|PAGER_CACHESPILL);

  /* Begin a transaction and take an exclusive lock on the main database
  ** file. This is done before the sqlite3BtreeGetPageSize(pMain) call below,
  ** to ensure that we do not try to change the page-size on a WAL database.
  */
  rc = execSql(db, pzErrMsg, "BEGIN");
  if( rc!=SQLITE_OK ) goto end_of_vacuum;
  rc = sqlite3BtreeBeginTrans(pMain, pOut==0 ? 2 : 0, 0);
  if( rc!=SQLITE_OK ) goto end_of_vacuum;

  /* Do not attempt to change the page size for a WAL database */
  if( sqlite3PagerGetJournalMode(sqlite3BtreePager(pMain))
                                               ==PAGER_JOURNALMODE_WAL ){
    db->nextPagesize = 0;
  }

  if( sqlite3BtreeSetPageSize(pTemp, sqlite3BtreeGetPageSize(pMain), nRes, 0)
   || (!isMemDb && sqlite3BtreeSetPageSize(pTemp, db->nextPagesize, nRes, 0))
   || NEVER(db->mallocFailed)
  ){
    rc = SQLITE_NOMEM_BKPT;
    goto end_of_vacuum;
  }

#ifndef SQLITE_OMIT_AUTOVACUUM
  sqlite3BtreeSetAutoVacuum(pTemp, db->nextAutovac>=0 ? db->nextAutovac :
                                           sqlite3BtreeGetAutoVacuum(pMain));
#endif

  /* Query the schema of the main database. Create a mirror schema
  ** in the temporary database.
  */
  db->init.iDb = nDb; /* force new CREATE statements into vacuum_db */
  rc = execSqlF(db, pzErrMsg,
      "SELECT sql FROM \"%w\".sqlite_master"
      " WHERE type='table'AND name<>'sqlite_sequence'"
      " AND coalesce(rootpage,1)>0",
      zDbMain
  );
  if( rc!=SQLITE_OK ) goto end_of_vacuum;
  rc = execSqlF(db, pzErrMsg,
      "SELECT sql FROM \"%w\".sqlite_master"
      " WHERE type='index'",
      zDbMain
  );
  if( rc!=SQLITE_OK ) goto end_of_vacuum;
  db->init.iDb = 0;

  /* Loop through the tables in the main database. For each, do
  ** an "INSERT INTO vacuum_db.xxx SELECT * FROM main.xxx;" to copy
  ** the contents to the temporary database.
  */
  rc = execSqlF(db, pzErrMsg,
      "SELECT'INSERT INTO vacuum_db.'||quote(name)"
      "||' SELECT*FROM\"%w\".'||quote(name)"
      "FROM vacuum_db.sqlite_master "
      "WHERE type='table'AND coalesce(rootpage,1)>0",
      zDbMain
  );
  assert( (db->mDbFlags & DBFLAG_Vacuum)!=0 );
  db->mDbFlags &= ~DBFLAG_Vacuum;
  if( rc!=SQLITE_OK ) goto end_of_vacuum;

  /* Copy the triggers, views, and virtual tables from the main database
  ** over to the temporary database.  None of these objects has any
  ** associated storage, so all we have to do is copy their entries
  ** from the SQLITE_MASTER table.
  */
  rc = execSqlF(db, pzErrMsg,
      "INSERT INTO vacuum_db.sqlite_master"
      " SELECT*FROM \"%w\".sqlite_master"
      " WHERE type IN('view','trigger')"
      " OR(type='table'AND rootpage=0)",
      zDbMain
  );
  if( rc ) goto end_of_vacuum;

  /* At this point, there is a write transaction open on both the 
  ** vacuum database and the main database. Assuming no error occurs,
  ** both transactions are closed by this block - the main database
  ** transaction by sqlite3BtreeCopyFile() and the other by an explicit
  ** call to sqlite3BtreeCommit().
  */
  {
    u32 meta;
    int i;

    /* This array determines which meta meta values are preserved in the
    ** vacuum.  Even entries are the meta value number and odd entries
    ** are an increment to apply to the meta value after the vacuum.
    ** The increment is used to increase the schema cookie so that other
    ** connections to the same database will know to reread the schema.
    */
    static const unsigned char aCopy[] = {
       BTREE_SCHEMA_VERSION,     1,  /* Add one to the old schema cookie */
       BTREE_DEFAULT_CACHE_SIZE, 0,  /* Preserve the default page cache size */
       BTREE_TEXT_ENCODING,      0,  /* Preserve the text encoding */
       BTREE_USER_VERSION,       0,  /* Preserve the user version */
       BTREE_APPLICATION_ID,     0,  /* Preserve the application id */
    };

    assert( 1==sqlite3BtreeIsInTrans(pTemp) );
    assert( pOut!=0 || 1==sqlite3BtreeIsInTrans(pMain) );

    /* Copy Btree meta values */
    for(i=0; i<ArraySize(aCopy); i+=2){
      /* GetMeta() and UpdateMeta() cannot fail in this context because
      ** we already have page 1 loaded into cache and marked dirty. */
      sqlite3BtreeGetMeta(pMain, aCopy[i], &meta);
      rc = sqlite3BtreeUpdateMeta(pTemp, aCopy[i], meta+aCopy[i+1]);
      if( NEVER(rc!=SQLITE_OK) ) goto end_of_vacuum;
    }

    if( pOut==0 ){
      rc = sqlite3BtreeCopyFile(pMain, pTemp);
    }
    if( rc!=SQLITE_OK ) goto end_of_vacuum;
    rc = sqlite3BtreeCommit(pTemp);
    if( rc!=SQLITE_OK ) goto end_of_vacuum;
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pOut==0 ){
      sqlite3BtreeSetAutoVacuum(pMain, sqlite3BtreeGetAutoVacuum(pTemp));
    }
#endif
  }

  assert( rc==SQLITE_OK );
  if( pOut==0 ){
    rc = sqlite3BtreeSetPageSize(pMain, sqlite3BtreeGetPageSize(pTemp), nRes,1);
  }

end_of_vacuum:
  /* Restore the original value of db->flags */
  db->init.iDb = 0;
  db->mDbFlags = saved_mDbFlags;
  db->flags = saved_flags;
  db->nChange = saved_nChange;
  db->nTotalChange = saved_nTotalChange;
  db->mTrace = saved_mTrace;
  sqlite3BtreeSetPageSize(pMain, -1, -1, 1);

  /* Currently there is an SQL level transaction open on the vacuum
  ** database. No locks are held on any other files (since the main file
  ** was committed at the btree level). So it safe to end the transaction
  ** by manually setting the autoCommit flag to true and detaching the
  ** vacuum database. The vacuum_db journal file is deleted when the pager
  ** is closed by the DETACH.
  */
  db->autoCommit = 1;

  if( pDb ){
    sqlite3BtreeClose(pDb->pBt);
    pDb->pBt = 0;
    pDb->pSchema = 0;
  }

  /* This both clears the schemas and reduces the size of the db->aDb[]
  ** array. */ 
  sqlite3ResetAllSchemasOfConnection(db);

  return rc;
}